

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O2

void __thiscall Gameplay::economyPhase(Gameplay *this)

{
  ostream *poVar1;
  Gameplay *pGVar2;
  Stronghold *this_00;
  string *psVar3;
  DynastyDeck *this_01;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ECONOMY PHASE");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  ArrangeTurns(this);
  pGVar2 = this;
  while (pGVar2 = (Gameplay *)
                  (pGVar2->players).super__List_base<Player,_std::allocator<Player>_>._M_impl.
                  _M_node.super__List_node_base._M_next,
        (this->it)._M_node = (_List_node_base *)pGVar2, pGVar2 != this) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Player ");
    this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
    psVar3 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
    poVar1 = std::operator<<(poVar1,(string *)psVar3);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    this_01 = Player::getProvinces((Player *)((this->it)._M_node + 1));
    DynastyDeck::PrintCards(this_01);
    Player::buyCards((Player *)((this->it)._M_node + 1));
    pGVar2 = (Gameplay *)(this->it)._M_node;
  }
  return;
}

Assistant:

void Gameplay::economyPhase()                                   //phase4: each player can buy black cards if he wants
{
    cout << "ECONOMY PHASE" << endl <<endl;
    this->ArrangeTurns();

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << it->getStronghold()->getName() << endl << endl;

        it->getProvinces().PrintCards();
        it->buyCards();
    }
}